

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O3

bool __thiscall QWidgetResizeHandler::eventFilter(QWidgetResizeHandler *this,QObject *o,QEvent *ee)

{
  int iVar1;
  QWidget *pQVar2;
  QWidgetData *pQVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  bool bVar7;
  QWidget *pQVar8;
  QPoint QVar9;
  byte bVar10;
  QMouseEvent *e;
  long in_FS_OFFSET;
  QPointF local_60;
  QPoint local_50;
  QPoint local_48;
  QPoint local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    cVar5 = '\0';
    if ((0x33 < (ulong)*(ushort *)(ee + 8)) ||
       ((0x800000000006cU >> ((ulong)*(ushort *)(ee + 8) & 0x3f) & 1) == 0)) goto LAB_0046ccfa;
    pQVar2 = *(QWidget **)(this + 0x10);
    pQVar8 = QApplication::activePopupWidget();
    if (pQVar8 == (QWidget *)0x0) {
      switch(*(short *)(ee + 8)) {
      case 2:
        bVar7 = QWidget::isMaximized(pQVar2);
        if (!bVar7) {
          pQVar2 = *(QWidget **)(this + 0x10);
          pQVar3 = pQVar2->data;
          iVar1 = *(int *)(this + 0x3c);
          local_40.yp.m_i = -iVar1;
          local_40.xp.m_i = -iVar1;
          local_38 = CONCAT44(((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + iVar1,
                              ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + iVar1);
          local_60.xp = (qreal)QEventPoint::globalPosition();
          local_50 = QPointF::toPoint(&local_60);
          local_48 = QWidget::mapFromGlobal(pQVar2,&local_50);
          cVar5 = QRect::contains(&local_40,SUB81(&local_48,0));
          if (cVar5 == '\0') goto LAB_0046ccfa;
          if (*(int *)(ee + 0x40) != 1) break;
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
          mouseMoveEvent(this,(QMouseEvent *)ee);
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 1);
          pQVar2 = *(QWidget **)(this + 0x10);
          local_60.xp = (qreal)QEventPoint::globalPosition();
          local_50 = QPointF::toPoint(&local_60);
          QVar9 = QWidget::mapFromGlobal(pQVar2,&local_50);
          *(QPoint *)(this + 0x20) = QVar9;
          lVar4 = *(long *)(*(long *)(this + 0x10) + 0x20);
          *(ulong *)(this + 0x28) =
               CONCAT44(*(int *)(lVar4 + 0x20) - (QVar9.yp.m_i.m_i + *(int *)(lVar4 + 0x18)),
                        *(int *)(lVar4 + 0x1c) - (*(int *)(lVar4 + 0x14) + QVar9.xp.m_i.m_i));
LAB_0046ccf2:
          if (*(int *)(this + 0x30) != 9) goto LAB_0046ccfa;
        }
        break;
      case 3:
        bVar7 = QWidget::isMaximized(pQVar2);
        if ((!bVar7) && (*(int *)(ee + 0x40) == 1)) {
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfc);
          QWidget::releaseMouse(*(QWidget **)(this + 0x10));
          QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
LAB_0046ccef:
          cVar5 = '\x01';
          goto LAB_0046ccf2;
        }
        break;
      case 4:
        break;
      case 5:
        bVar7 = QWidget::isMaximized(pQVar2);
        if (!bVar7) {
          if (((byte)this[0x40] & 1) == 0) {
            bVar10 = 0;
          }
          else {
            bVar10 = (byte)ee[0x44] & 1;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar10);
          mouseMoveEvent(this,(QMouseEvent *)ee);
          goto LAB_0046ccef;
        }
        break;
      case 6:
        keyPressEvent(this,(QKeyEvent *)ee);
        break;
      default:
        if (*(short *)(ee + 8) == 0x33) {
          bVar6 = QGuiApplication::mouseButtons();
          bVar10 = (byte)this[0x40] & 1;
          if ((bVar6 & 1) == 0) {
            bVar10 = 0;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar10);
          if (bVar10 != 0) {
            ee[0xc] = (QEvent)0x1;
            cVar5 = '\x01';
            goto LAB_0046ccfa;
          }
        }
      }
    }
    else if ((((byte)this[0x40] & 1) != 0) && (*(short *)(ee + 8) == 3)) {
      this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
    }
  }
  cVar5 = '\0';
LAB_0046ccfa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)cVar5;
}

Assistant:

bool QWidgetResizeHandler::eventFilter(QObject *o, QEvent *ee)
{
    if (!isEnabled()
        || (ee->type() != QEvent::MouseButtonPress
            && ee->type() != QEvent::MouseButtonRelease
            && ee->type() != QEvent::MouseMove
            && ee->type() != QEvent::KeyPress
            && ee->type() != QEvent::ShortcutOverride)
        )
        return false;

    Q_ASSERT(o == widget);
    QWidget *w = widget;
    if (QApplication::activePopupWidget()) {
        if (buttonDown && ee->type() == QEvent::MouseButtonRelease)
            buttonDown = false;
        return false;
    }

    switch (ee->type()) {
    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        if (w->isMaximized())
            break;
        const QRect widgetRect = widget->rect().marginsAdded(QMargins(range, range, range, range));
        const QPoint cursorPoint = widget->mapFromGlobal(e->globalPosition().toPoint());
        if (!widgetRect.contains(cursorPoint))
            return false;
        if (e->button() == Qt::LeftButton) {
            buttonDown = false;
            emit activate();
            mouseMoveEvent(e);
            buttonDown = true;
            moveOffset = widget->mapFromGlobal(e->globalPosition().toPoint());
            invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
            if (mode != Center)
                return true;
        }
    } break;
    case QEvent::MouseButtonRelease:
        if (w->isMaximized())
            break;
        if (static_cast<QMouseEvent *>(ee)->button() == Qt::LeftButton) {
            active = false;
            buttonDown = false;
            widget->releaseMouse();
            widget->releaseKeyboard();
            if (mode != Center)
                return true;
        }
        break;
    case QEvent::MouseMove: {
        if (w->isMaximized())
            break;
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        buttonDown = buttonDown && (e->buttons() & Qt::LeftButton); // safety, state machine broken!
        mouseMoveEvent(e);
        if (mode != Center)
            return true;
    } break;
    case QEvent::KeyPress:
        keyPressEvent(static_cast<QKeyEvent *>(ee));
        break;
    case QEvent::ShortcutOverride:
        buttonDown &= ((QGuiApplication::mouseButtons() & Qt::LeftButton) != Qt::NoButton);
        if (buttonDown) {
            ee->accept();
            return true;
        }
        break;
    default:
        break;
    }

    return false;
}